

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O1

void uv__fs_work(uv__work *w)

{
  int iVar1;
  uv__work *ptr;
  iovec *__iovec;
  _func_void_uv__work_ptr_int *p_Var2;
  bool bVar3;
  __mode_t __mode;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint *puVar10;
  _func_void_uv__work_ptr *p_Var11;
  ssize_t sVar12;
  size_t sVar13;
  _func_void_uv__work_ptr *p_Var14;
  _func_void_uv__work_ptr_int *p_Var15;
  ulong uVar16;
  char *pcVar17;
  size_t sVar18;
  long lVar19;
  void *pvVar20;
  code *pcVar21;
  _func_void_uv__work_ptr_int *p_Var22;
  _func_void_uv__work_ptr_int *p_Var23;
  size_t sVar24;
  size_t sVar25;
  double dVar26;
  pollfd pfd;
  stat pbuf;
  int local_210c;
  _func_void_uv__work_ptr_int *local_2108;
  _func_void_uv__work_ptr_int *local_20e0;
  long local_20d8;
  undefined1 *local_20d0;
  stat local_20c8;
  undefined1 local_2038 [16];
  void *local_2028;
  void *local_2020;
  uint local_2018;
  uv_loop_s *local_2010;
  void *local_2008;
  _func_void_uv__work_ptr *local_2000;
  uv_fs_type local_1ff8;
  undefined4 uStack_1ff4;
  uv_loop_t *local_1ff0;
  uv_fs_cb p_Stack_1fe8;
  _func_void_uv__work_ptr_int *local_1fe0;
  uv_loop_s *puStack_1fd8;
  _func_void_uv__work_ptr *local_1fd0;
  _func_void_uv__work_ptr_int *local_1fc8;
  char *local_1f28;
  int local_1f20;
  uint local_1f1c;
  uv_buf_t *local_1f10;
  _func_void_uv__work_ptr_int *local_1f08;
  uv__work local_1ee8;
  size_t local_1eb8;
  
  iVar1 = *(int *)&w[-7].done;
  puVar10 = (uint *)__errno_location();
  do {
    *puVar10 = 0;
    switch(*(undefined4 *)&w[-7].done) {
    case 1:
      if (uv__fs_open_no_cloexec_support == '\0') {
        uVar7 = open((char *)w[-6].done,*(uint *)((long)w[-2].wq + 4) | 0x80000,
                     (ulong)*(uint *)(w[-2].wq + 1));
        if (-1 < (int)uVar7) {
          p_Var23 = (_func_void_uv__work_ptr_int *)(ulong)uVar7;
          goto LAB_0048fe07;
        }
        if (*puVar10 != 0x16) break;
        uv__fs_open_no_cloexec_support = '\x01';
      }
      if (w[-7].wq[0] != (void *)0x0) {
        uv_rwlock_rdlock(&(w[-7].loop)->cloexec_lock);
      }
      iVar6 = open((char *)w[-6].done,*(int *)((long)w[-2].wq + 4),(ulong)*(uint *)(w[-2].wq + 1));
      if ((-1 < iVar6) && (iVar8 = uv__cloexec_ioctl(iVar6,1), iVar8 != 0)) {
        iVar8 = uv__close(iVar6);
        iVar6 = -1;
        if (iVar8 != 0) {
switchD_0048f646_default:
          abort();
        }
      }
      if (w[-7].wq[0] != (void *)0x0) {
        uv_rwlock_rdunlock(&(w[-7].loop)->cloexec_lock);
      }
LAB_0048fb2f:
      p_Var23 = (_func_void_uv__work_ptr_int *)(long)iVar6;
      goto LAB_0048fe07;
    case 2:
      uVar7 = close(*(int *)w[-2].wq);
      break;
    case 3:
      uVar7 = uv__getiovmax();
      if (uVar7 < *(uint *)((long)w[-2].wq + 0xc)) {
        *(uint *)((long)w[-2].wq + 0xc) = uVar7;
      }
      p_Var23 = w[-1].done;
      iVar6 = *(int *)((long)w[-2].wq + 0xc);
      if ((long)p_Var23 < 0) {
        if (iVar6 == 1) {
          p_Var23 = (_func_void_uv__work_ptr_int *)
                    read(*(int *)w[-2].wq,*(void **)w[-1].work,*(size_t *)(w[-1].work + 8));
        }
        else {
          p_Var23 = (_func_void_uv__work_ptr_int *)readv(*(int *)w[-2].wq,(iovec *)w[-1].work,iVar6)
          ;
        }
      }
      else {
        if (iVar6 == 1) {
          iVar6 = *(int *)w[-2].wq;
          pvVar20 = *(void **)w[-1].work;
          sVar24 = *(size_t *)(w[-1].work + 8);
        }
        else {
          if (uv__fs_read_no_preadv != '\x01') {
            p_Var23 = (_func_void_uv__work_ptr_int *)
                      uv__preadv(*(int *)w[-2].wq,(iovec *)w[-1].work,iVar6,(int64_t)p_Var23);
            if ((p_Var23 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) ||
               (p_Var23 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, *puVar10 != 0x26))
            goto LAB_00490254;
            uv__fs_read_no_preadv = '\x01';
          }
          iVar6 = *(int *)w[-2].wq;
          pvVar20 = *(void **)w[-1].work;
          sVar24 = *(size_t *)(w[-1].work + 8);
          p_Var23 = w[-1].done;
        }
        p_Var23 = (_func_void_uv__work_ptr_int *)pread(iVar6,pvVar20,sVar24,(__off_t)p_Var23);
      }
LAB_00490254:
      if ((uv__work *)w[-1].work != w + 1) {
        uv__free((uv__work *)w[-1].work);
      }
      w[-1].work = (_func_void_uv__work_ptr *)0x0;
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      goto LAB_0048fe07;
    case 4:
      uVar4 = uv__getiovmax();
      uVar7 = *(uint *)((long)w[-2].wq + 0xc);
      ptr = (uv__work *)w[-1].work;
      if (uVar7 == 0) {
        p_Var23 = (_func_void_uv__work_ptr_int *)0x0;
      }
      else {
        p_Var23 = (_func_void_uv__work_ptr_int *)0x0;
        do {
          uVar5 = uVar4;
          if (uVar7 < uVar4) {
            uVar5 = uVar7;
          }
          *(uint *)((long)w[-2].wq + 0xc) = uVar5;
          do {
            p_Var15 = w[-1].done;
            iVar6 = *(int *)((long)w[-2].wq + 0xc);
            if ((long)p_Var15 < 0) {
              __iovec = (iovec *)w[-1].work;
              if (iVar6 == 1) {
                p_Var15 = (_func_void_uv__work_ptr_int *)
                          write(*(int *)w[-2].wq,__iovec->iov_base,__iovec->iov_len);
              }
              else {
                p_Var15 = (_func_void_uv__work_ptr_int *)writev(*(int *)w[-2].wq,__iovec,iVar6);
              }
            }
            else {
              if (iVar6 == 1) {
                iVar6 = *(int *)w[-2].wq;
                pvVar20 = *(void **)w[-1].work;
                sVar24 = *(size_t *)(w[-1].work + 8);
              }
              else {
                if (uv__fs_write_no_pwritev != '\x01') {
                  p_Var15 = (_func_void_uv__work_ptr_int *)
                            uv__pwritev(*(int *)w[-2].wq,(iovec *)w[-1].work,iVar6,(int64_t)p_Var15)
                  ;
                  if ((p_Var15 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) ||
                     (p_Var15 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, *puVar10 != 0x26)
                     ) goto LAB_0048f9f4;
                  uv__fs_write_no_pwritev = '\x01';
                }
                iVar6 = *(int *)w[-2].wq;
                pvVar20 = *(void **)w[-1].work;
                sVar24 = *(size_t *)(w[-1].work + 8);
                p_Var15 = w[-1].done;
              }
              p_Var15 = (_func_void_uv__work_ptr_int *)pwrite(iVar6,pvVar20,sVar24,(__off_t)p_Var15)
              ;
            }
LAB_0048f9f4:
          } while (((long)p_Var15 < 0) && (*puVar10 == 4));
          if ((long)p_Var15 < 1) {
            if (p_Var23 == (_func_void_uv__work_ptr_int *)0x0) {
              p_Var23 = p_Var15;
            }
            break;
          }
          if (-1 < (long)w[-1].done) {
            w[-1].done = w[-1].done + (long)p_Var15;
          }
          p_Var11 = w[-1].work;
          pcVar21 = p_Var11 + 8;
          uVar5 = 0;
          p_Var22 = p_Var15;
          do {
            p_Var2 = *(_func_void_uv__work_ptr_int **)pcVar21;
            if (p_Var22 < p_Var2) {
              *(_func_void_uv__work_ptr_int **)(pcVar21 + -8) = p_Var22 + *(ulong *)(pcVar21 + -8);
              *(ulong *)pcVar21 = *(ulong *)pcVar21 - (long)p_Var22;
              break;
            }
            uVar5 = uVar5 + 1;
            pcVar21 = pcVar21 + 0x10;
            p_Var22 = p_Var22 + -(long)p_Var2;
          } while (p_Var22 != (_func_void_uv__work_ptr_int *)0x0);
          *(uint *)((long)w[-2].wq + 0xc) = uVar5;
          w[-1].work = p_Var11 + (ulong)uVar5 * 0x10;
          p_Var23 = p_Var23 + (long)p_Var15;
          uVar7 = uVar7 - uVar5;
        } while (uVar7 != 0);
      }
      if (ptr != w + 1) {
        uv__free(ptr);
      }
      w[-1].work = (_func_void_uv__work_ptr *)0x0;
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      goto LAB_0048fe07;
    case 5:
      local_20e0 = w[-1].done;
      sVar12 = sendfile(*(int *)w[-2].wq,*(int *)((long)w[-2].wq + 4),(off_t *)&local_20e0,
                        (size_t)w[1].done);
      if ((sVar12 == -1) && (local_2108 = w[-1].done, (long)local_20e0 <= (long)local_2108)) {
        uVar7 = *puVar10;
        if (((uVar7 < 0x17) && ((0x440020U >> (uVar7 & 0x1f) & 1) != 0)) ||
           (p_Var23 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, uVar7 == 0x58)) {
          *puVar10 = 0;
          p_Var15 = w[1].done;
          if (p_Var15 == (_func_void_uv__work_ptr_int *)0x0) {
            p_Var23 = (_func_void_uv__work_ptr_int *)0x0;
          }
          else {
            iVar6 = *(int *)w[-2].wq;
            iVar8 = *(int *)((long)w[-2].wq + 4);
            bVar3 = true;
            p_Var22 = (_func_void_uv__work_ptr_int *)0x0;
            do {
              while( true ) {
                p_Var23 = p_Var22;
                sVar24 = (long)p_Var15 - (long)p_Var23;
                if (0x1fff < sVar24) {
                  sVar24 = 0x2000;
                }
                do {
                  if (bVar3) {
                    sVar18 = pread(iVar8,local_2038,sVar24,(__off_t)local_2108);
                  }
                  else {
                    sVar18 = read(iVar8,local_2038,sVar24);
                  }
                } while ((sVar18 == 0xffffffffffffffff) && (*puVar10 == 4));
                if (sVar18 == 0) goto LAB_00490395;
                if (sVar18 == 0xffffffffffffffff) break;
                if (0 < (long)sVar18) {
                  lVar19 = 0;
                  sVar24 = sVar18;
LAB_0049018f:
                  local_20d0 = local_2038 + lVar19;
                  local_20d8 = lVar19;
LAB_004901a2:
                  do {
                    sVar12 = write(iVar6,local_20d0,sVar24);
                    if (sVar12 != -1) goto LAB_0049020f;
                    if (*puVar10 != 4) {
                      if (*puVar10 == 0xb) {
                        local_20c8.st_dev._4_4_ = 4;
                        local_20c8.st_dev._0_4_ = iVar6;
                        while (iVar9 = poll((pollfd *)&local_20c8,1,-1), iVar9 == -1) {
                          if (*puVar10 != 4) goto LAB_00490380;
                        }
                        if ((local_20c8.st_dev._4_4_ & 0xfffb0000) == 0) goto LAB_004901a2;
LAB_00490380:
                        *puVar10 = 5;
                      }
                      p_Var23 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
                      goto LAB_00490395;
                    }
                  } while( true );
                }
LAB_00490226:
                local_2108 = local_2108 + sVar18;
                p_Var23 = p_Var23 + sVar18;
                p_Var22 = p_Var23;
                if (p_Var15 <= p_Var23) goto LAB_00490395;
              }
              if ((!bVar3) || (p_Var23 != (_func_void_uv__work_ptr_int *)0x0)) break;
              bVar3 = false;
              p_Var22 = (_func_void_uv__work_ptr_int *)0x0;
            } while ((*puVar10 == 5) ||
                    (p_Var22 = (_func_void_uv__work_ptr_int *)0x0, *puVar10 == 0x1d));
            p_Var23 = (_func_void_uv__work_ptr_int *)
                      ((ulong)p_Var23 | -(ulong)(p_Var23 == (_func_void_uv__work_ptr_int *)0x0));
          }
LAB_00490395:
          if (p_Var23 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) goto LAB_0048f76b;
        }
      }
      else {
        p_Var23 = local_20e0 + -(long)w[-1].done;
        local_2108 = local_20e0;
LAB_0048f76b:
        w[-1].done = local_2108;
      }
      goto LAB_0048fe07;
    case 6:
      uVar7 = stat((char *)w[-6].done,(stat *)local_2038);
      goto LAB_0048fb5b;
    case 7:
      uVar7 = lstat((char *)w[-6].done,(stat *)local_2038);
      goto LAB_0048fb5b;
    case 8:
      uVar7 = fstat(*(int *)w[-2].wq,(stat *)local_2038);
LAB_0048fb5b:
      if (uVar7 == 0) {
        w[-6].loop = (uv_loop_s *)local_2038._0_8_;
        w[-6].wq[0] = (void *)((ulong)local_2020 & 0xffffffff);
        w[-6].wq[1] = local_2028;
        w[-5].work = (_func_void_uv__work_ptr *)((ulong)local_2020 >> 0x20);
        w[-5].done = (_func_void_uv__work_ptr_int *)(ulong)local_2018;
        w[-5].loop = local_2010;
        w[-5].wq[0] = (void *)local_2038._8_8_;
        w[-5].wq[1] = local_2008;
        w[-4].work = local_2000;
        w[-4].done = (_func_void_uv__work_ptr_int *)CONCAT44(uStack_1ff4,local_1ff8);
        w[-4].wq[1] = local_1ff0;
        w[-3].work = (_func_void_uv__work_ptr *)p_Stack_1fe8;
        w[-3].done = local_1fe0;
        w[-3].loop = puStack_1fd8;
        w[-3].wq[0] = local_1fd0;
        w[-3].wq[1] = local_1fc8;
        w[-2].work = local_1fd0;
        w[-2].done = local_1fc8;
        w[-4].loop = (uv_loop_s *)0x0;
        w[-4].wq[0] = (void *)0x0;
      }
      break;
    case 9:
      uVar7 = ftruncate(*(int *)w[-2].wq,(__off_t)w[-1].done);
      break;
    case 10:
      local_2038._0_8_ = (undefined8)(double)w[-1].wq[0];
      dVar26 = (double)w[-1].wq[0] * 1000000.0;
      uVar16 = (ulong)dVar26;
      local_2038._8_8_ =
           (((long)(dVar26 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16) % 1000000) *
           1000;
      local_2028 = (void *)(long)(double)w[-1].wq[1];
      dVar26 = (double)w[-1].wq[1] * 1000000.0;
      uVar16 = (ulong)dVar26;
      local_2020 = (void *)((((long)(dVar26 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16
                             ) % 1000000) * 1000);
      uVar7 = utimensat(-100,(char *)w[-6].done,(timespec *)local_2038,0);
      break;
    case 0xb:
      local_2038._0_8_ = (undefined8)(double)w[-1].wq[0];
      dVar26 = (double)w[-1].wq[0] * 1000000.0;
      uVar16 = (ulong)dVar26;
      local_2038._8_8_ =
           (((long)(dVar26 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16) % 1000000) *
           1000;
      local_2028 = (void *)(long)(double)w[-1].wq[1];
      dVar26 = (double)w[-1].wq[1] * 1000000.0;
      uVar16 = (ulong)dVar26;
      local_2020 = (void *)((((long)(dVar26 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16
                             ) % 1000000) * 1000);
      uVar7 = futimens(*(int *)w[-2].wq,(timespec *)local_2038);
      break;
    case 0xc:
      uVar7 = access((char *)w[-6].done,*(int *)((long)w[-2].wq + 4));
      break;
    case 0xd:
      uVar7 = chmod((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0xe:
      uVar7 = fchmod(*(int *)w[-2].wq,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0xf:
      uVar7 = fsync(*(int *)w[-2].wq);
      break;
    case 0x10:
      uVar7 = fdatasync(*(int *)w[-2].wq);
      break;
    case 0x11:
      uVar7 = unlink((char *)w[-6].done);
      break;
    case 0x12:
      uVar7 = rmdir((char *)w[-6].done);
      break;
    case 0x13:
      uVar7 = mkdir((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
      break;
    case 0x14:
      pcVar17 = mkdtemp((char *)w[-6].done);
      p_Var23 = (_func_void_uv__work_ptr_int *)-(ulong)(pcVar17 == (char *)0x0);
      goto LAB_0048fe07;
    case 0x15:
      uVar7 = rename((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x16:
      local_2038._0_8_ = (uv_loop_s *)0x0;
      iVar6 = scandir((char *)w[-6].done,(dirent ***)local_2038,uv__fs_scandir_filter,
                      uv__fs_scandir_sort);
      *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
      if (iVar6 != -1) {
        if (iVar6 == 0) {
          free((void *)local_2038._0_8_);
          local_2038._0_8_ = (uv_loop_s *)0x0;
        }
        w[-6].work = (_func_void_uv__work_ptr *)local_2038._0_8_;
        goto LAB_0048fb2f;
      }
LAB_0048fe2c:
      p_Var23 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      goto LAB_0048fe07;
    case 0x17:
      uVar7 = link((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x18:
      uVar7 = symlink((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x19:
      sVar13 = pathconf((char *)w[-6].done,4);
      sVar25 = 0x100;
      if (sVar13 != 0xffffffffffffffff) {
        sVar25 = sVar13;
      }
      p_Var11 = (_func_void_uv__work_ptr *)uv__malloc(sVar25);
      if (p_Var11 == (_func_void_uv__work_ptr *)0x0) {
        *puVar10 = 0xc;
      }
      else {
        sVar13 = readlink((char *)w[-6].done,(char *)p_Var11,sVar25);
        if (sVar13 != 0xffffffffffffffff) {
          p_Var14 = p_Var11;
          if ((sVar13 == sVar25) &&
             (p_Var14 = (_func_void_uv__work_ptr *)uv__realloc(p_Var11,sVar13 + 1),
             p_Var14 == (_func_void_uv__work_ptr *)0x0)) {
            uv__free(p_Var11);
            goto LAB_0049035c;
          }
          p_Var14[sVar13] = (_func_void_uv__work_ptr)0x0;
          w[-6].work = p_Var14;
LAB_00490365:
          p_Var23 = (_func_void_uv__work_ptr_int *)0x0;
          goto LAB_0048fe07;
        }
        uv__free(p_Var11);
      }
      p_Var23 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      goto LAB_0048fe07;
    case 0x1a:
      uVar7 = chown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
      break;
    case 0x1b:
      uVar7 = fchown(*(int *)w[-2].wq,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
      break;
    case 0x1c:
      p_Var11 = (_func_void_uv__work_ptr *)realpath((char *)w[-6].done,(char *)0x0);
      if (p_Var11 == (_func_void_uv__work_ptr *)0x0) goto LAB_0048fe2c;
      w[-6].work = p_Var11;
      p_Var23 = (_func_void_uv__work_ptr_int *)0x0;
      goto LAB_0048fe07;
    case 0x1d:
      uVar7 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-6].done,0,0,(uv_fs_cb)0x0
                        );
      uv_fs_req_cleanup((uv_fs_t *)local_2038);
      if ((int)uVar7 < 0) {
        p_Var23 = (_func_void_uv__work_ptr_int *)(long)(int)uVar7;
      }
      else {
        iVar6 = fstat(uVar7,&local_20c8);
        __mode = local_20c8.st_mode;
        if (iVar6 == 0) {
          local_210c = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].loop,
                                  (*(uint *)((long)w[-2].wq + 4) & 1) << 7 | 0x241,
                                  local_20c8.st_mode,(uv_fs_cb)0x0);
          uv_fs_req_cleanup((uv_fs_t *)local_2038);
          iVar6 = local_210c;
          if (-1 < local_210c) {
            iVar6 = fchmod(local_210c,__mode);
            if (iVar6 == -1) {
              iVar6 = -*puVar10;
            }
            else if (((ulong)w[-2].wq[0] & 0x600000000) == 0) {
LAB_0048ffb4:
              if (local_20c8.st_size == 0) {
                iVar6 = 0;
              }
              else {
                p_Var23 = (_func_void_uv__work_ptr_int *)0x0;
                sVar25 = local_20c8.st_size;
                do {
                  local_2038._8_4_ = 6;
                  local_1ff8 = UV_FS_SENDFILE;
                  local_1f28 = (char *)0x0;
                  local_1f10 = (uv_buf_t *)0x0;
                  local_1fd0 = (_func_void_uv__work_ptr *)0x0;
                  local_1fe0 = (_func_void_uv__work_ptr_int *)0x0;
                  puStack_1fd8 = (uv_loop_s *)0x0;
                  local_1ff0 = (uv_loop_t *)0x0;
                  p_Stack_1fe8 = (uv_fs_cb)0x0;
                  local_1f20 = local_210c;
                  local_1f1c = uVar7;
                  local_1f08 = p_Var23;
                  local_1eb8 = sVar25;
                  uv__fs_work(&local_1ee8);
                  iVar6 = (int)local_1fe0;
                  uv_fs_req_cleanup((uv_fs_t *)local_2038);
                  if (iVar6 < 0) break;
                  p_Var23 = p_Var23 + (long)local_1fe0;
                  sVar25 = sVar25 - (long)local_1fe0;
                } while (sVar25 != 0);
              }
            }
            else {
              iVar8 = ioctl(local_210c,0x40049409,(ulong)uVar7);
              iVar6 = 0;
              if (iVar8 == -1) {
                uVar4 = *puVar10;
                if (((uVar4 == 0x12) || (uVar4 == 0x19)) || (uVar4 == 0x5f)) {
                  iVar6 = -0x5f;
                  if (((ulong)w[-2].wq[0] & 0x400000000) == 0) goto LAB_0048ffb4;
                }
                else {
                  iVar6 = -uVar4;
                }
              }
            }
          }
        }
        else {
          local_210c = -1;
          iVar6 = -*puVar10;
        }
        iVar8 = 0;
        if (iVar6 < 0) {
          iVar8 = iVar6;
        }
        iVar9 = uv__close_nocheckstdio(uVar7);
        if (iVar9 == 0) {
          iVar9 = iVar8;
        }
        if (iVar6 < 0) {
          iVar9 = iVar8;
        }
        if (-1 < local_210c) {
          iVar6 = uv__close_nocheckstdio(local_210c);
          if (iVar6 == 0) {
            iVar6 = iVar9;
          }
          if (iVar9 != 0) {
            iVar6 = iVar9;
          }
          iVar9 = 0;
          if (iVar6 != 0) {
            uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].loop,(uv_fs_cb)0x0);
            uv_fs_req_cleanup((uv_fs_t *)local_2038);
            iVar9 = iVar6;
          }
        }
        if (iVar9 == 0) goto LAB_00490365;
        *puVar10 = -iVar9;
LAB_0049035c:
        p_Var23 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      }
      goto LAB_0048fe07;
    case 0x1e:
      uVar7 = lchown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4))
      ;
      break;
    default:
      goto switchD_0048f646_default;
    }
    p_Var23 = (_func_void_uv__work_ptr_int *)(long)(int)uVar7;
LAB_0048fe07:
    p_Var15 = p_Var23;
    if (p_Var23 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) goto LAB_004903c8;
  } while ((iVar1 - 4U < 0xfffffffe) && (*puVar10 == 4));
  p_Var15 = (_func_void_uv__work_ptr_int *)-(long)(int)*puVar10;
LAB_004903c8:
  w[-7].wq[1] = p_Var15;
  if ((p_Var23 == (_func_void_uv__work_ptr_int *)0x0) && (*(int *)&w[-7].done - 6U < 3)) {
    w[-6].work = (_func_void_uv__work_ptr *)&w[-6].loop;
  }
  return;
LAB_0049020f:
  lVar19 = local_20d8 + sVar12;
  sVar24 = sVar18 - lVar19;
  if (sVar24 == 0 || (long)sVar18 < lVar19) goto LAB_00490226;
  goto LAB_0049018f;
}

Assistant:

static void uv__fs_work(struct uv__work* w) {
  int retry_on_eintr;
  uv_fs_t* req;
  ssize_t r;

  req = container_of(w, uv_fs_t, work_req);
  retry_on_eintr = !(req->fs_type == UV_FS_CLOSE ||
                     req->fs_type == UV_FS_READ);

  do {
    errno = 0;

#define X(type, action)                                                       \
  case UV_FS_ ## type:                                                        \
    r = action;                                                               \
    break;

    switch (req->fs_type) {
    X(ACCESS, access(req->path, req->flags));
    X(CHMOD, chmod(req->path, req->mode));
    X(CHOWN, chown(req->path, req->uid, req->gid));
    X(CLOSE, close(req->file));
    X(COPYFILE, uv__fs_copyfile(req));
    X(FCHMOD, fchmod(req->file, req->mode));
    X(FCHOWN, fchown(req->file, req->uid, req->gid));
    X(LCHOWN, lchown(req->path, req->uid, req->gid));
    X(FDATASYNC, uv__fs_fdatasync(req));
    X(FSTAT, uv__fs_fstat(req->file, &req->statbuf));
    X(FSYNC, uv__fs_fsync(req));
    X(FTRUNCATE, ftruncate(req->file, req->off));
    X(FUTIME, uv__fs_futime(req));
    X(LSTAT, uv__fs_lstat(req->path, &req->statbuf));
    X(LINK, link(req->path, req->new_path));
    X(MKDIR, mkdir(req->path, req->mode));
    X(MKDTEMP, uv__fs_mkdtemp(req));
    X(OPEN, uv__fs_open(req));
    X(READ, uv__fs_read(req));
    X(SCANDIR, uv__fs_scandir(req));
    X(READLINK, uv__fs_readlink(req));
    X(REALPATH, uv__fs_realpath(req));
    X(RENAME, rename(req->path, req->new_path));
    X(RMDIR, rmdir(req->path));
    X(SENDFILE, uv__fs_sendfile(req));
    X(STAT, uv__fs_stat(req->path, &req->statbuf));
    X(SYMLINK, symlink(req->path, req->new_path));
    X(UNLINK, unlink(req->path));
    X(UTIME, uv__fs_utime(req));
    X(WRITE, uv__fs_write_all(req));
    default: abort();
    }
#undef X
  } while (r == -1 && errno == EINTR && retry_on_eintr);

  if (r == -1)
    req->result = UV__ERR(errno);
  else
    req->result = r;

  if (r == 0 && (req->fs_type == UV_FS_STAT ||
                 req->fs_type == UV_FS_FSTAT ||
                 req->fs_type == UV_FS_LSTAT)) {
    req->ptr = &req->statbuf;
  }
}